

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O3

StringRef __thiscall llvm::Twine::getSingleStringRef(Twine *this)

{
  size_t sVar1;
  char *__s;
  StringRef SVar2;
  
  if (this->RHSKind != EmptyKind) {
switchD_00118276_caseD_2:
    __assert_fail("isSingleStringRef() &&\"This cannot be had as a single stringref!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                  ,0x1b6,"StringRef llvm::Twine::getSingleStringRef() const");
  }
  switch(this->LHSKind) {
  default:
    goto switchD_00118276_caseD_2;
  case CStringKind:
    __s = (this->LHS).cString;
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      break;
    }
  case EmptyKind:
    __s = (char *)0x0;
    sVar1 = 0;
    break;
  case StdStringKind:
  case StringRefKind:
    __s = (char *)*(this->LHS).decUL;
    sVar1 = (this->LHS).decUL[1];
    break;
  case SmallStringKind:
    __s = (char *)*(this->LHS).decUL;
    sVar1 = (size_t)(uint)(this->LHS).decUL[1];
  }
  SVar2.Length = sVar1;
  SVar2.Data = __s;
  return SVar2;
}

Assistant:

bool isSingleStringRef() const {
      if (getRHSKind() != EmptyKind) return false;

      switch (getLHSKind()) {
      case EmptyKind:
      case CStringKind:
      case StdStringKind:
      case StringRefKind:
      case SmallStringKind:
        return true;
      default:
        return false;
      }
    }